

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::
     redo_arbit_decomposition<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>>
               (__normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
                begin,__normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
                      end,
               __normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
               out,size_t new_local_size,comm *comm)

{
  bool bVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  unsigned_long uVar5;
  iterator __first;
  iterator __last;
  unsigned_long_long uVar6;
  reference pvVar7;
  unsigned_long *puVar8;
  reference msgs;
  reference out_00;
  undefined1 local_110 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  size_t nsend;
  size_t left_to_send;
  size_t new_prefix;
  int first_p;
  undefined1 local_c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  undefined1 local_90 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_local_sizes;
  size_t prefix;
  size_t total_size;
  comm *local_38;
  size_t local_size;
  comm *comm_local;
  size_t new_local_size_local;
  __normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
  out_local;
  __normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
  end_local;
  __normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
  begin_local;
  
  local_size = (size_t)comm;
  comm_local = (comm *)new_local_size;
  new_local_size_local = (size_t)out._M_current;
  out_local = end;
  end_local = begin;
  local_38 = (comm *)std::
                     distance<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>>
                               (begin,end);
  iVar3 = mxx::comm::size((comm *)local_size);
  if (iVar3 == 1) {
    if (local_38 != comm_local) {
      assert_fail("local_size == new_local_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                  ,0x19a,"redo_arbit_decomposition");
    }
    std::
    copy<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>>
              (end_local,out_local,
               (__normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
                )new_local_size_local);
  }
  else {
    uVar5 = allreduce<unsigned_long>((unsigned_long *)&local_38,(comm *)local_size);
    new_local_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)exscan<unsigned_long>((unsigned_long *)&local_38,(comm *)local_size);
    iVar3 = mxx::comm::rank((comm *)local_size);
    if (iVar3 == 0) {
      new_local_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    allgather<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
               (unsigned_long *)&comm_local,(comm *)local_size);
    __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
    uVar6 = std::
            accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_long>
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )__first._M_current,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )__last._M_current,0);
    if (uVar6 != uVar5) {
      assert_fail("std::accumulate(new_local_sizes.begin(), new_local_sizes.end(), 0ull) == total_size"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                  ,0x1b8,"redo_arbit_decomposition");
    }
    iVar3 = mxx::comm::size((comm *)local_size);
    _first_p = 0;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&new_prefix + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,(long)iVar3,
               (value_type_conflict1 *)&first_p,(allocator<unsigned_long> *)((long)&new_prefix + 7))
    ;
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&new_prefix + 7));
    left_to_send = 0;
    new_prefix._0_4_ = 0;
    while ((iVar3 = (int)new_prefix, iVar4 = mxx::comm::size((comm *)local_size),
           sVar2 = left_to_send, iVar3 < iVar4 + -1 &&
           (pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
                                (long)(int)new_prefix),
           (pointer)(sVar2 + *pvVar7) <=
           new_local_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage))) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
                          (long)(int)new_prefix);
      left_to_send = *pvVar7 + left_to_send;
      new_prefix._0_4_ = (int)new_prefix + 1;
    }
    nsend = (size_t)local_38;
    while( true ) {
      iVar3 = (int)new_prefix;
      bVar1 = false;
      if (nsend != 0) {
        iVar4 = mxx::comm::size((comm *)local_size);
        bVar1 = iVar3 < iVar4;
      }
      if (!bVar1) break;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,
                          (long)(int)new_prefix);
      left_to_send = *pvVar7 + left_to_send;
      recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(left_to_send -
                    (long)new_local_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      puVar8 = std::min<unsigned_long>
                         ((unsigned_long *)
                          &recv_counts.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,&nsend);
      uVar5 = *puVar8;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,
                          (long)(int)new_prefix);
      *pvVar7 = uVar5;
      nsend = nsend - uVar5;
      new_local_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(uVar5 + (long)new_local_sizes.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      new_prefix._0_4_ = (int)new_prefix + 1;
    }
    all2all<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,(comm *)local_size)
    ;
    msgs = __gnu_cxx::
           __normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
           ::operator*(&end_local);
    out_00 = __gnu_cxx::
             __normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
             ::operator*((__normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
                          *)&new_local_size_local);
    all2allv<TwoBSA<unsigned_int>>
              (msgs,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,out_00,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110,(comm *)local_size
              );
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_110);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
  }
  return;
}

Assistant:

void redo_arbit_decomposition(_InIterator begin, _InIterator end, _OutIterator out, std::size_t new_local_size, const mxx::comm& comm) {
    // get local size
    std::size_t local_size = std::distance(begin, end);

    // if single process, simply copy to output
    if (comm.size() == 1) {
        MXX_ASSERT(local_size == new_local_size);
        std::copy(begin, end, out);
        return;
    }

    // get prefix sum of size and total size
#if !defined(NDEBUG) || MEASURE_LOAD_BALANCE != 0
    size_t total_size = mxx::allreduce(local_size, comm);
#endif
    size_t prefix = mxx::exscan(local_size, comm);
    if (comm.rank() == 0)
        prefix = 0;

#if MEASURE_LOAD_BALANCE
    size_t min = mxx::reduce(local_size, 0, mxx::min<size_t>(), comm);
    size_t max = mxx::reduce(local_size, 0, mxx::max<size_t>(), comm);
    size_t min_new = mxx::reduce(new_local_size, 0, mxx::min<size_t>(), comm);
    size_t max_new = mxx::reduce(new_local_size, 0, mxx::max<size_t>(), comm);
    if(comm.rank() == 0)
      std::cerr << " Decomposition: old [" << min << "," << max << "], new= [" << min_new << "," << max_new << "], for n=" << total_size << " fair decomposition: " << total_size / comm.size() << std::endl;

    std::vector<std::size_t> toReceive = mxx::gather(new_local_size, 0, comm);
    if(comm.rank() == 0)
      std::cerr << toReceive << std::endl;
#endif

    // get the new local sizes from all processors
    // NOTE: this all-gather is what makes the arbitrary decomposition worse
    // in terms of complexity than when assuming a block decomposition
    std::vector<std::size_t> new_local_sizes = mxx::allgather(new_local_size, comm);
    MXX_ASSERT(std::accumulate(new_local_sizes.begin(), new_local_sizes.end(), 0ull) == total_size);

    // calculate where to send elements
    std::vector<size_t> send_counts(comm.size(), 0);
    int first_p;
    std::size_t new_prefix = 0;
    for (first_p = 0; first_p < comm.size()-1; ++first_p)
    {
        // find processor for which the prefix sum exceeds mine
        // i have to send to the previous
        if (new_prefix + new_local_sizes[first_p] > prefix)
            break;
        new_prefix += new_local_sizes[first_p];
    }

    //= block_partition_target_processor(total_size, p, prefix);
    std::size_t left_to_send = local_size;
    for (; left_to_send > 0 && first_p < comm.size(); ++first_p)
    {
        // make the `new` prefix inclusive (is an exlcusive prefix prior)
        new_prefix += new_local_sizes[first_p];
        // send as many elements to the current processor as it needs to fill
        // up, but at most as many as I have left
        std::size_t nsend = std::min<std::size_t>(new_prefix - prefix, left_to_send);
        send_counts[first_p] = nsend;
        // update the number of elements i have left (`left_to_send`) and
        // at which global index they start `prefix`
        left_to_send -= nsend;
        prefix += nsend;
    }

    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    // TODO: all2allv for iterators
    mxx::all2allv(&(*begin), send_counts, &(*out), recv_counts, comm);
}